

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

FString ExpandEnvVars(char *searchpathstring)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_RSI;
  bool bVar4;
  FString local_60;
  char *local_58;
  char *varvalue;
  FString local_40;
  FString varname;
  size_t length;
  char *local_28;
  char *nextchars;
  char *dollar;
  char *searchpathstring_local;
  FString *out;
  
  if (in_RSI == (char *)0x0) {
    FString::FString((FString *)searchpathstring,"");
  }
  else {
    nextchars = strchr(in_RSI,0x24);
    if (nextchars == (char *)0x0) {
      FString::FString((FString *)searchpathstring,in_RSI);
    }
    else {
      FString::FString((FString *)searchpathstring,in_RSI,(long)nextchars - (long)in_RSI);
      local_28 = in_RSI;
      while( true ) {
        bVar4 = false;
        if (nextchars != (char *)0x0) {
          bVar4 = *local_28 != '\0';
        }
        if (!bVar4) break;
        varname.Chars =
             (char *)strspn(nextchars + 1,
                            "01234567890ABCDEFGHIJKLMNOPQRSTUVWXYZ_abcdefghijklmnopqrstuvwxyz");
        if (varname.Chars == (char *)0x0) {
          FString::operator+=((FString *)searchpathstring,'$');
        }
        else {
          FString::FString(&local_40,nextchars + 1,(size_t)varname.Chars);
          pcVar2 = FString::operator_cast_to_char_(&local_40);
          iVar1 = strcasecmp(pcVar2,"progdir");
          if (iVar1 == 0) {
            FString::operator+=((FString *)searchpathstring,&progdir);
          }
          else {
            pcVar2 = FString::operator_cast_to_char_(&local_40);
            local_58 = getenv(pcVar2);
            if ((local_58 != (char *)0x0) && (sVar3 = strlen(local_58), sVar3 != 0)) {
              FString::operator+=((FString *)searchpathstring,local_58);
            }
          }
          FString::~FString(&local_40);
        }
        local_28 = nextchars + varname.Chars + 1;
        nextchars = strchr(local_28,0x24);
        if (nextchars != (char *)0x0) {
          FString::FString(&local_60,local_28,(long)nextchars - (long)local_28);
          FString::operator+=((FString *)searchpathstring,&local_60);
          FString::~FString(&local_60);
        }
      }
      if (*local_28 != '\0') {
        FString::operator+=((FString *)searchpathstring,local_28);
      }
    }
  }
  return (FString)searchpathstring;
}

Assistant:

FString ExpandEnvVars(const char *searchpathstring)
{
	static const char envvarnamechars[] =
		"01234567890"
		"ABCDEFGHIJKLMNOPQRSTUVWXYZ"
		"_"
		"abcdefghijklmnopqrstuvwxyz";

	if (searchpathstring == NULL)
		return FString("");

	const char *dollar = strchr(searchpathstring, '$');
	if (dollar == NULL)
	{
		return FString(searchpathstring);
	}

	const char *nextchars = searchpathstring;
	FString out = FString(searchpathstring, dollar - searchpathstring);
	while ( (dollar != NULL) && (*nextchars != 0) )
	{
		size_t length = strspn(dollar + 1, envvarnamechars);
		if (length != 0)
		{
			FString varname = FString(dollar + 1, length);
			if (stricmp(varname, "progdir") == 0)
			{
				out += progdir;
			}
			else
			{
				char *varvalue = getenv(varname);
				if ( (varvalue != NULL) && (strlen(varvalue) != 0) )
				{
					out += varvalue;
				}
			}
		}
		else
		{
			out += '$';
		}
		nextchars = dollar + length + 1;
		dollar = strchr(nextchars, '$');
		if (dollar != NULL)
		{
			out += FString(nextchars, dollar - nextchars);
		}
	}
	if (*nextchars != 0)
	{
		out += nextchars;
	}
	return out;
}